

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O2

void vepu511_h265e_dump(H265eV511HalContext *ctx,HalEncTask *enc_task)

{
  uint uVar1;
  H265eSyntax_new *pHVar2;
  uint uVar3;
  HalBuf *pHVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  char name [128];
  
  pHVar2 = ctx->syn;
  pHVar4 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)(pHVar2->sp).ref_pic.slot_idx);
  sVar5 = mpp_buffer_get_size_with_caller(*pHVar4->buf,"vepu511_h265e_dump");
  sVar6 = mpp_buffer_get_size_with_caller(pHVar4->buf[1],"vepu511_h265e_dump");
  pvVar7 = mpp_buffer_get_ptr_with_caller(*pHVar4->buf,"vepu511_h265e_dump");
  pvVar8 = mpp_buffer_get_ptr_with_caller(pHVar4->buf[1],"vepu511_h265e_dump");
  uVar1 = ctx->frms[(enc_task->flags).reg_idx]->frame_count;
  uVar3 = getpid();
  snprintf(name,0x7f,"/mnt/sdcard/dump/refr_fbd_%d_frm%d.bin",(ulong)uVar3,(ulong)uVar1);
  save_to_file_511(name,(void *)((long)pvVar7 + (long)ctx->fbc_header_len),
                   sVar5 - (long)ctx->fbc_header_len);
  snprintf(name,0x7f,"/mnt/sdcard/dump/refr_fbh_%d_frm%d.bin",(ulong)uVar3,(ulong)uVar1);
  save_to_file_511(name,pvVar7,(long)ctx->fbc_header_len);
  snprintf(name,0x7f,"/mnt/sdcard/dump/refr_dsp_%d_frm%d.bin",(ulong)uVar3,(ulong)uVar1);
  save_to_file_511(name,pvVar8,sVar6);
  pHVar4 = hal_bufs_get_buf(ctx->dpb_bufs,(uint)(pHVar2->sp).recon_pic.slot_idx);
  sVar5 = mpp_buffer_get_size_with_caller(*pHVar4->buf,"vepu511_h265e_dump");
  sVar6 = mpp_buffer_get_size_with_caller(pHVar4->buf[1],"vepu511_h265e_dump");
  pvVar7 = mpp_buffer_get_ptr_with_caller(*pHVar4->buf,"vepu511_h265e_dump");
  pvVar8 = mpp_buffer_get_ptr_with_caller(pHVar4->buf[1],"vepu511_h265e_dump");
  snprintf(name,0x7f,"/mnt/sdcard/dump/recn_fbd_%d_frm%d_slot%d.bin",(ulong)uVar3,(ulong)uVar1,
           (ulong)(pHVar2->sp).recon_pic.slot_idx);
  save_to_file_511(name,(void *)((long)pvVar7 + (long)ctx->fbc_header_len),
                   sVar5 - (long)ctx->fbc_header_len);
  snprintf(name,0x7f,"/mnt/sdcard/dump/recn_fbh_%d_frm%d_slot%d.bin",(ulong)uVar3,(ulong)uVar1,
           (ulong)(pHVar2->sp).recon_pic.slot_idx);
  save_to_file_511(name,pvVar7,(long)ctx->fbc_header_len);
  snprintf(name,0x7f,"/mnt/sdcard/dump/recn_dsp_%d_frm%d_slot%d.bin",(ulong)uVar3,(ulong)uVar1,
           (ulong)(pHVar2->sp).recon_pic.slot_idx);
  save_to_file_511(name,pvVar8,sVar6);
  return;
}

Assistant:

void vepu511_h265e_dump(H265eV511HalContext *ctx, HalEncTask *enc_task)
{
    H265eSyntax_new *syn = ctx->syn;
    HalBuf *hal_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.ref_pic.slot_idx);
    size_t buf_size = mpp_buffer_get_size(hal_buf->buf[0]);
    size_t dws_size = mpp_buffer_get_size(hal_buf->buf[1]);
    void *ptr = mpp_buffer_get_ptr(hal_buf->buf[0]);
    void *dws_ptr = mpp_buffer_get_ptr(hal_buf->buf[1]);
    RK_U32 frm_num = ctx->frms[enc_task->flags.reg_idx]->frame_count;
    RK_S32 pid = getpid();
    char name[128];
    size_t name_len = sizeof(name) - 1;

    snprintf(name, name_len, "/mnt/sdcard/dump/refr_fbd_%d_frm%d.bin", pid, frm_num);
    save_to_file_511(name, ptr + ctx->fbc_header_len, buf_size - ctx->fbc_header_len);

    snprintf(name, name_len, "/mnt/sdcard/dump/refr_fbh_%d_frm%d.bin", pid, frm_num);
    save_to_file_511(name, ptr, ctx->fbc_header_len);

    snprintf(name, name_len, "/mnt/sdcard/dump/refr_dsp_%d_frm%d.bin", pid, frm_num);
    save_to_file_511(name, dws_ptr, dws_size);

    hal_buf = hal_bufs_get_buf(ctx->dpb_bufs, syn->sp.recon_pic.slot_idx);
    buf_size = mpp_buffer_get_size(hal_buf->buf[0]);
    dws_size = mpp_buffer_get_size(hal_buf->buf[1]);
    ptr = mpp_buffer_get_ptr(hal_buf->buf[0]);
    dws_ptr = mpp_buffer_get_ptr(hal_buf->buf[1]);

    snprintf(name, name_len, "/mnt/sdcard/dump/recn_fbd_%d_frm%d_slot%d.bin", pid, frm_num,  syn->sp.recon_pic.slot_idx);
    save_to_file_511(name, ptr + ctx->fbc_header_len, buf_size - ctx->fbc_header_len);

    snprintf(name, name_len, "/mnt/sdcard/dump/recn_fbh_%d_frm%d_slot%d.bin", pid, frm_num,  syn->sp.recon_pic.slot_idx);
    save_to_file_511(name, ptr, ctx->fbc_header_len);

    snprintf(name, name_len, "/mnt/sdcard/dump/recn_dsp_%d_frm%d_slot%d.bin", pid, frm_num,  syn->sp.recon_pic.slot_idx);
    save_to_file_511(name, dws_ptr, dws_size);

}